

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx512::forward
          (Yolov3DetectionOutput_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar2;
  ulong uVar3;
  pointer pMVar4;
  _func_int *p_Var5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  iterator __position;
  Mat *this_01;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined8 uVar21;
  undefined4 *puVar22;
  _func_int *p_Var23;
  float *pfVar24;
  ulong uVar25;
  BBoxRect *__args;
  long lVar26;
  long lVar27;
  int iVar28;
  uint _h;
  float *pfVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  float fVar34;
  float fVar35;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 extraout_var [60];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1c8;
  long local_1b0;
  BBoxRect local_1a8;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_188;
  ulong local_170;
  pointer local_168;
  ulong local_160;
  uint *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  undefined1 local_138 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_120;
  Option *local_118;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_110;
  long local_108;
  long local_100;
  void *local_f8;
  ulong local_f0;
  Yolov3DetectionOutput_x86_avx512 *local_e8;
  long local_e0;
  undefined8 local_d8;
  void *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined1 local_58 [32];
  undefined1 auVar43 [16];
  
  local_188.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = top_blobs;
  local_118 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar25 = 0;
    local_110 = bottom_blobs;
    local_e8 = this;
    do {
      pvVar17 = local_110;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1c8,
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]));
      pMVar4 = (pvVar17->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      p_Var5 = this->_vptr_Yolov3DetectionOutput_x86_avx512[-3];
      iVar18 = pMVar4[uVar25].c / *(int *)(&this->field_0xd4 + (long)p_Var5);
      if (iVar18 != *(int *)(&this->field_0xd0 + (long)p_Var5) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1c8);
        iVar18 = -1;
        goto LAB_004ae34c;
      }
      local_170 = uVar25;
      if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]))
      {
        local_168 = pMVar4 + uVar25;
        uVar3._0_4_ = local_168->w;
        uVar3._4_4_ = local_168->h;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar3;
        auVar32 = vcvtdq2ps_avx(auVar32);
        p_Var23 = (_func_int *)
                  ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx512 +
                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]);
        uVar2 = *(undefined4 *)(*(long *)(&this->field_0x170 + (long)p_Var5) + uVar25 * 4);
        auVar30._4_4_ = uVar2;
        auVar30._0_4_ = uVar2;
        auVar30._8_4_ = uVar2;
        auVar30._12_4_ = uVar2;
        auVar30 = vmulps_avx512vl(auVar32,auVar30);
        local_160 = uVar3 >> 0x20;
        lVar26 = CONCAT44((int)(uVar25 >> 0x20),(undefined4)uVar3);
        local_c8 = vroundps_avx(auVar30,0xb);
        local_108 = (long)iVar18;
        auVar36._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar36._12_4_ = 0x3f000000;
        local_a8 = auVar32._0_8_;
        register0x00001248 = auVar36._8_8_;
        auVar32 = vrcpps_avx(_local_a8);
        auVar31._8_4_ = 0x3f800000;
        auVar31._0_8_ = 0x3f8000003f800000;
        auVar31._12_4_ = 0x3f800000;
        auVar30 = vfmsub213ps_avx512vl(auVar32,_local_a8,auVar31);
        _local_b8 = vfnmadd132ps_fma(auVar30,auVar32,auVar32);
        local_100 = (long)*(int *)(&this->field_0xd4 + (long)p_Var5) * uVar25 * 4;
        local_1b0 = 0;
        local_e0 = lVar26;
        do {
          uVar25 = local_168->elemsize;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar25;
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               (long)local_168->d * uVar25 * (long)local_168->h * (long)local_168->w + 0xf &
               0xfffffffffffffff0;
          uVar21 = SUB168(auVar10 / auVar9,0);
          if (0 < (int)local_160) {
            lVar27 = local_1b0 * local_108;
            local_f8 = (void *)((lVar27 + 5) * local_168->cstep * uVar25 + (long)local_168->data);
            auVar37._8_8_ = 0;
            auVar37._0_8_ =
                 *(ulong *)(*(long *)(p_Var23 + 0xe0) +
                           (long)((int)*(float *)(*(long *)(p_Var23 + 0x128) + local_100 +
                                                 local_1b0 * 4) * 2) * 4);
            auVar31 = vpbroadcastd_avx512vl();
            auVar32 = vpmulld_avx(auVar31,_DAT_0055c9c0);
            auVar30 = vpmulld_avx(auVar31,_DAT_0055c9d0);
            auVar33 = vpexpandd_avx512vl(ZEXT1632(auVar31));
            auVar11 = vpermq_avx2(ZEXT1632(auVar32),0xd0);
            auVar11 = vpblendd_avx2(auVar11,ZEXT432(auVar33._4_4_) << 0x20,3);
            uVar50 = auVar30._0_8_;
            auVar33._8_8_ = uVar50;
            auVar33._0_8_ = uVar50;
            auVar33._16_8_ = uVar50;
            auVar33._24_8_ = uVar50;
            local_58 = vpblendd_avx2(auVar11,auVar33,0xc0);
            sVar6 = local_168->cstep;
            pvVar7 = local_168->data;
            sVar8 = local_168->elemsize;
            pfVar29 = (float *)((lVar27 + 4) * sVar6 * sVar8 + (long)pvVar7);
            local_148 = (float *)((lVar27 + 3) * sVar6 * sVar8 + (long)pvVar7);
            local_150 = (float *)((lVar27 + 2) * sVar6 * sVar8 + (long)pvVar7);
            local_158 = (uint *)((lVar27 + 1) * sVar6 * sVar8 + (long)pvVar7);
            local_140 = (float *)(lVar27 * sVar6 * sVar8 + (long)pvVar7);
            iVar18 = SUB164(auVar10 / auVar9,0);
            auVar43._8_4_ = 0x3f800000;
            auVar43._0_8_ = 0x3f8000003f800000;
            auVar43._12_4_ = 0x3f800000;
            auVar45 = ZEXT1664(auVar43);
            local_98 = vmovlhps_avx(auVar43,auVar37);
            uVar25 = 0;
            local_d8 = uVar21;
            do {
              local_f0 = uVar25;
              if (0 < (int)lVar26) {
                auVar38._0_4_ = (float)(int)uVar25;
                local_d0 = (void *)((long)local_f8 + uVar25 * lVar26 * 4);
                auVar38._4_4_ = auVar38._0_4_;
                auVar38._8_4_ = auVar38._0_4_;
                auVar38._12_4_ = auVar38._0_4_;
                local_88 = vunpcklpd_avx(auVar38,local_c8);
                lVar27 = 0;
                do {
                  pfVar1 = (float *)((long)local_d0 + lVar27 * 4);
                  p_Var5 = this->_vptr_Yolov3DetectionOutput_x86_avx512[-3];
                  iVar19 = (*(uint *)(&this->field_0xd0 + (long)p_Var5) & 0xfffffff8) * (int)uVar21;
                  pfVar24 = pfVar1;
                  if (iVar19 < 1) {
                    iVar20 = 0;
                    auVar53 = ZEXT464(0xff7fffff);
                    iVar28 = 0;
                  }
                  else {
                    iVar28 = 0;
                    auVar53 = ZEXT464(0xff7fffff);
                    iVar20 = 0;
                    do {
                      auVar11 = vpcmpeqd_avx2(auVar45._0_32_,auVar45._0_32_);
                      auVar42 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar11);
                      auVar11 = vpermpd_avx2(auVar42,0x4e);
                      auVar11 = vmaxps_avx(auVar42,auVar11);
                      auVar33 = vshufpd_avx(auVar11,auVar11,5);
                      auVar11 = vmaxps_avx(auVar11,auVar33);
                      auVar33 = vshufps_avx(auVar11,auVar11,0xb1);
                      auVar11 = vmaxps_avx(auVar11,auVar33);
                      auVar45 = ZEXT3264(auVar11);
                      if (auVar53._0_4_ < auVar11._0_4_) {
                        uVar50 = vcmpps_avx512vl(auVar42,auVar11,0);
                        iVar28 = 0;
                        if ((uint)uVar50 != 0) {
                          for (; ((uint)uVar50 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
                          }
                        }
                        iVar28 = iVar28 + iVar20;
                        auVar53 = ZEXT1664(auVar11._0_16_);
                      }
                      pfVar24 = pfVar24 + iVar18 * 8;
                      iVar20 = iVar20 + 8;
                    } while (pfVar24 < pfVar1 + iVar19);
                  }
                  for (; local_138 = auVar53._0_16_,
                      pfVar24 < pfVar1 + (int)(*(uint *)(&this->field_0xd0 + (long)p_Var5) *
                                              (int)uVar21); pfVar24 = pfVar24 + iVar18) {
                    if (auVar53._0_4_ < *pfVar24) {
                      iVar28 = iVar20;
                    }
                    auVar32 = vmaxss_avx(ZEXT416((uint)*pfVar24),local_138);
                    auVar53 = ZEXT1664(auVar32);
                    iVar20 = iVar20 + 1;
                  }
                  fVar34 = expf(-*pfVar29);
                  auVar12._8_4_ = 0x80000000;
                  auVar12._0_8_ = 0x8000000080000000;
                  auVar12._12_4_ = 0x80000000;
                  auVar32 = vxorps_avx512vl(local_138,auVar12);
                  fVar35 = expf(auVar32._0_4_);
                  this = local_e8;
                  auVar45 = ZEXT464(0x3f800000);
                  auVar32 = vfmadd132ss_fma(ZEXT416((uint)(fVar35 + 1.0)),auVar45._0_16_,
                                            ZEXT416((uint)fVar34));
                  fVar34 = 1.0 / auVar32._0_4_;
                  if (*(float *)(&local_e8->field_0xd8 + (long)p_Var5) <= fVar34) {
                    fVar35 = expf(-*local_140);
                    local_138 = ZEXT416((uint)(fVar35 + 1.0));
                    auVar13._8_4_ = 0x80000000;
                    auVar13._0_8_ = 0x8000000080000000;
                    auVar13._12_4_ = 0x80000000;
                    auVar32 = vxorps_avx512vl(ZEXT416(*local_158),auVar13);
                    fVar35 = expf(auVar32._0_4_);
                    local_78 = ZEXT416((uint)(fVar35 + 1.0));
                    local_68 = expf(*local_150);
                    uStack_64 = extraout_XMM0_Db;
                    auVar45._0_4_ = expf(*local_148);
                    auVar45._4_60_ = extraout_var;
                    auVar32 = vinsertps_avx(local_138,ZEXT416((uint)local_78._0_4_),0x10);
                    auVar30 = vrcpps_avx(auVar32);
                    auVar51._0_4_ = local_98._0_4_ * auVar30._0_4_;
                    auVar51._4_4_ = local_98._4_4_ * auVar30._4_4_;
                    auVar51._8_4_ = local_98._8_4_ * auVar30._8_4_;
                    auVar51._12_4_ = local_98._12_4_ * auVar30._12_4_;
                    auVar32 = vfmsub213ps_fma(auVar32,auVar51,local_98);
                    auVar31 = vfnmadd213ps_fma(auVar32,auVar30,auVar51);
                    auVar46._8_8_ = CONCAT44(uStack_64,local_68);
                    auVar46._0_8_ = CONCAT44(uStack_64,local_68);
                    auVar32 = vinsertps_avx(auVar46,auVar45._0_16_,0x30);
                    auVar14._4_8_ = auVar32._8_8_;
                    auVar14._0_4_ = local_98._4_4_ * auVar32._4_4_;
                    auVar39._0_8_ = auVar14._0_8_ << 0x20;
                    auVar39._8_4_ = local_98._8_4_ * auVar32._8_4_;
                    auVar39._12_4_ = local_98._12_4_ * auVar32._12_4_;
                    auVar40._8_8_ = auVar39._8_8_;
                    auVar40._0_8_ = auVar31._0_8_;
                    auVar47._0_4_ = (float)(int)lVar27;
                    auVar47._4_12_ = local_88._4_12_;
                    auVar32 = vrcpps_avx(auVar47);
                    auVar52._0_4_ = auVar31._0_4_ * auVar32._0_4_;
                    auVar52._4_4_ = auVar31._4_4_ * auVar32._4_4_;
                    auVar52._8_4_ = auVar39._8_4_ * auVar32._8_4_;
                    auVar52._12_4_ = auVar39._12_4_ * auVar32._12_4_;
                    auVar30 = vfmsub231ps_fma(auVar40,auVar47,auVar52);
                    auVar36 = vfnmadd213ps_fma(auVar30,auVar32,auVar52);
                    auVar44._0_4_ = (auVar31._0_4_ + auVar47._0_4_) * (float)local_b8._0_4_;
                    auVar44._4_4_ = (auVar31._4_4_ + local_88._4_4_) * (float)local_b8._4_4_;
                    auVar44._8_4_ = (auVar31._8_4_ + local_88._8_4_) * fStack_b0;
                    auVar44._12_4_ = (auVar31._12_4_ + local_88._12_4_) * fStack_ac;
                    auVar48._0_4_ = auVar36._0_4_ * (float)local_a8._0_4_;
                    auVar48._4_4_ = auVar36._4_4_ * (float)local_a8._4_4_;
                    auVar48._8_4_ = auVar36._8_4_ * fStack_a0;
                    auVar48._12_4_ = auVar36._12_4_ * fStack_9c;
                    auVar32 = vshufpd_avx(auVar48,auVar44,1);
                    auVar30 = vsubps_avx(auVar44,auVar32);
                    auVar15._4_8_ = auVar48._8_8_;
                    auVar15._0_4_ = auVar48._4_4_ + auVar32._4_4_;
                    auVar49._0_8_ = auVar15._0_8_ << 0x20;
                    auVar49._8_4_ = auVar48._8_4_ + auVar32._8_4_;
                    auVar49._12_4_ = auVar48._12_4_ + auVar32._12_4_;
                    uVar21 = auVar49._8_8_;
                    auVar45 = ZEXT1664(CONCAT88(uVar21,auVar30._0_8_));
                    auVar32 = vmovshdup_avx(auVar36);
                    auVar41._0_4_ = auVar32._0_4_ * auVar36._0_4_;
                    auVar41._4_4_ = auVar32._4_4_ * auVar36._4_4_;
                    auVar41._8_4_ = auVar32._8_4_ * auVar36._8_4_;
                    auVar41._12_4_ = auVar32._12_4_ * auVar36._12_4_;
                    local_1a8.xmin = auVar30._0_4_;
                    local_1a8.ymin = auVar30._4_4_;
                    local_1a8.area = (float)vextractps_avx(auVar41,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1c8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1b0);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_1a8.score = fVar34;
                    local_1a8.xmax = auVar49._8_4_;
                    local_1a8.ymax = auVar49._12_4_;
                    local_1a8.label = iVar28;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_1a8);
                    }
                    else {
                      auVar16._8_4_ = local_1a8.area;
                      auVar16._0_8_ = uVar21;
                      auVar16._12_4_ = iVar28;
                      auVar45 = ZEXT1664(auVar16);
                      (__position._M_current)->xmax = (float)(int)uVar21;
                      (__position._M_current)->ymax = (float)(int)((ulong)uVar21 >> 0x20);
                      (__position._M_current)->area = local_1a8.area;
                      (__position._M_current)->label = iVar28;
                      (__position._M_current)->score = fVar34;
                      (__position._M_current)->xmin = local_1a8.xmin;
                      (__position._M_current)->ymin = local_1a8.ymin;
                      (__position._M_current)->xmax = auVar49._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  local_140 = local_140 + 1;
                  local_158 = local_158 + 1;
                  local_150 = local_150 + 1;
                  local_148 = local_148 + 1;
                  pfVar29 = pfVar29 + 1;
                  lVar27 = lVar27 + 1;
                  lVar26 = local_e0;
                  uVar21 = local_d8;
                } while (lVar27 != local_e0);
              }
              uVar25 = local_f0 + 1;
            } while (uVar25 != local_160);
          }
          local_1b0 = local_1b0 + 1;
          p_Var23 = (_func_int *)
                    ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx512 +
                    (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]);
        } while (local_1b0 <
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]
                         ));
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]))
      {
        lVar26 = 8;
        lVar27 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_188,
                     local_188.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8),
                     *(undefined8 *)
                      ((long)&((local_1c8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar26));
          lVar27 = lVar27 + 1;
          lVar26 = lVar26 + 0x18;
        } while (lVar27 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1c8);
      uVar25 = local_170 + 1;
    } while (uVar25 < (ulong)(((long)(local_110->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_110->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx512 +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]),&local_188);
  local_1a8.score = 0.0;
  local_1a8.xmin = 0.0;
  local_1a8.ymin = 0.0;
  local_1a8.xmax = 0.0;
  local_1a8.ymax = 0.0;
  local_1a8.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx512 +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]),&local_188,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]))
  ;
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar26 = CONCAT44(local_1a8.xmin,local_1a8.score);
  if (CONCAT44(local_1a8.xmax,local_1a8.ymin) != lVar26) {
    uVar25 = 0;
    do {
      __args = local_188.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar26 + uVar25 * 8);
      if (local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1c8,
                   (iterator)
                   local_1c8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar21 = *(undefined8 *)__args;
        uVar50 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1c8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar21;
        *(undefined8 *)
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar50;
        local_1c8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar25 = uVar25 + 1;
      lVar26 = CONCAT44(local_1a8.xmin,local_1a8.score);
    } while (uVar25 < (ulong)(CONCAT44(local_1a8.xmax,local_1a8.ymin) - lVar26 >> 3));
  }
  _h = (int)((long)local_1c8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1c8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
  iVar18 = 0;
  if (_h != 0) {
    this_01 = (local_120->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,local_118->blob_allocator);
    iVar18 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar18 = 0, 0 < (int)_h)) {
      iVar19 = this_01->w;
      sVar6 = this_01->elemsize;
      puVar22 = (undefined4 *)((long)this_01->data + 0x14);
      iVar18 = 0;
      lVar26 = 0;
      do {
        uVar2 = *(undefined4 *)
                 ((long)&((local_1c8.
                           super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar26);
        puVar22[-5] = (float)(*(int *)((long)&local_1c8.
                                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1].
                                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar26) +
                             1);
        puVar22[-4] = uVar2;
        puVar22[-3] = *(undefined4 *)
                       ((long)&((local_1c8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar26 + 4);
        puVar22[-2] = *(undefined4 *)
                       ((long)&((local_1c8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar26);
        puVar22[-1] = *(undefined4 *)
                       ((long)&((local_1c8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar26 + 4);
        *puVar22 = *(undefined4 *)
                    ((long)&((local_1c8.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar26);
        lVar26 = lVar26 + 0x1c;
        puVar22 = (undefined4 *)((long)puVar22 + (long)iVar19 * sVar6);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar26);
    }
  }
  if (local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar7 = (void *)CONCAT44(local_1a8.xmin,local_1a8.score);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,CONCAT44(local_1a8.area,local_1a8.ymax) - (long)pvVar7);
  }
LAB_004ae34c:
  if (local_188.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar18;
}

Assistant:

int Yolov3DetectionOutput_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}